

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
          (compute_order *this,
          solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
          *solver,bit_array *x)

{
  uint uVar1;
  pointer ppVar2;
  pair<int,_int> pVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  pair<int,_int> pVar8;
  pair<int,_int> local_60;
  pair<int,_int> local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  *local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_40;
  sparse_matrix<int> *local_38;
  
  ppVar2 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  local_50._M_head_impl = (int *)&this->m_order;
  uVar7 = 0;
  uVar1 = solver->m;
  local_38 = &solver->ap;
  local_48 = solver;
  local_40._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )this;
  do {
    if (uVar7 == uVar1) {
      return (int)((ulong)((long)*(pointer *)
                                  ((long)local_40._M_t.
                                         super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                         .
                                         super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                         ._M_head_impl + 0x20) -
                          (long)(((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)((long)local_40._M_t.
                                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                            .
                                            super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                            ._M_head_impl + 0x18))->
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    sparse_matrix<int>::row((sparse_matrix<int> *)&local_60,(int)local_38);
    pVar3 = local_60;
    iVar6 = 0;
    for (pVar8 = local_58; pVar8 != pVar3; pVar8 = (pair<int,_int>)((long)pVar8 + 8)) {
      iVar4 = bit_array::operator[](x,*(int *)((long)pVar8 + 4));
      iVar6 = iVar6 + iVar4;
    }
    iVar4 = (local_48->b)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar7];
    uVar5 = iVar4 - iVar6;
    if (uVar5 == 0 || iVar4 < iVar6) {
      if (iVar4 < iVar6) {
        uVar5 = iVar6 - iVar4;
        goto LAB_002318af;
      }
    }
    else {
LAB_002318af:
      local_60 = (pair<int,_int>)((ulong)uVar5 << 0x20 | uVar7);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 local_50._M_head_impl,&local_60);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }